

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplifyMathematicalExpressions.cpp
# Opt level: O0

bool isNumber(string *input)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int local_1c;
  int i;
  string *input_local;
  
  local_1c = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= (ulong)(long)local_1c) {
      return true;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    iVar1 = isdigit((int)*pcVar3);
    if ((iVar1 == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input), *pcVar3 != '.')) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool isNumber(std::string input) {
    for (int i = 0; i < input.size(); ++i) {
        if(!std::isdigit(input[i])){
            if(input[i] == '.'){
                continue;
            }
            return false;
        }
    }
    return true;
}